

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.h
# Opt level: O3

void __thiscall RasterizerA3<4U>::clear(RasterizerA3<4U> *this)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  Cell *pCVar12;
  ulong uVar13;
  ulong uVar14;
  
  if ((this->super_CellRasterizer).super_Rasterizer._width != 0) {
    uVar1 = (this->_yBounds).start;
    uVar4 = (ulong)(int)uVar1;
    uVar2 = (this->_yBounds).end;
    if (uVar1 <= uVar2) {
      pCVar12 = this->_cells + this->_cellStride * uVar4;
      puVar7 = this->_bits + this->_bitStride * uVar4;
      do {
        sVar6 = this->_bitStride;
        uVar14 = 0;
        do {
          uVar9 = *puVar7;
          *puVar7 = 0;
          if (uVar9 != 0) {
            uVar13 = (ulong)(this->super_CellRasterizer).super_Rasterizer._width;
            if (uVar14 + 0x100 < uVar13) {
              uVar13 = uVar14 + 0x100;
            }
            do {
              lVar3 = 0;
              if (uVar9 != 0) {
                for (; (uVar9 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                }
              }
              uVar11 = -1L << ((byte)lVar3 & 0x3f);
              uVar5 = (uint)((int)lVar3 << 2) | uVar14;
              if (uVar9 == uVar11) {
                if (uVar5 + 4 < uVar13) {
                  uVar13 = uVar5 + 4;
                }
                memset(pCVar12 + uVar5,0,(uVar13 - uVar5) * 8);
                break;
              }
              uVar11 = uVar11 ^ uVar9;
              lVar3 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                }
              }
              uVar10 = -1L << ((byte)lVar3 & 0x3f);
              uVar9 = uVar10 ^ uVar11;
              uVar8 = (uint)((int)lVar3 << 2) | uVar14;
              if (uVar13 <= uVar8) {
                uVar8 = uVar13;
              }
              memset(pCVar12 + uVar5,0,(uVar8 - uVar5) * 8);
            } while (uVar11 != uVar10);
          }
          uVar14 = uVar14 + 0x100;
          puVar7 = puVar7 + 1;
          sVar6 = sVar6 - 1;
        } while (sVar6 != 0);
        pCVar12 = pCVar12 + this->_cellStride;
        uVar4 = uVar4 + 1;
      } while (uVar4 <= (ulong)(long)(int)uVar2);
    }
    (this->_yBounds).start = 0x7fffffff;
    (this->_yBounds).end = 0;
  }
  return;
}

Assistant:

inline bool isInitialized() const noexcept { return _width != 0; }